

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O1

string * __thiscall
re2::Prefilter::DebugString_abi_cxx11_(string *__return_storage_ptr__,Prefilter *this)

{
  Prefilter *pPVar1;
  pointer pcVar2;
  char *pcVar3;
  string *s;
  char *pcVar4;
  ulong uVar5;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [46];
  
  switch(this->op_) {
  case ALL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
    goto LAB_0012a6c9;
  case NONE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "*no-matches*";
    pcVar3 = "";
LAB_0012a6c9:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
    break;
  case ATOM:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->atom_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->atom_)._M_string_length);
    break;
  case AND:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    if ((this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pPVar1 = (this->subs_->
                 super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
        if (pPVar1 == (Prefilter *)0x0) {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"<nil>","");
        }
        else {
          DebugString_abi_cxx11_((string *)local_1b0,pPVar1);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 **)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  case OR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    if ((this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pPVar1 = (this->subs_->
                 super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
        if (pPVar1 == (Prefilter *)0x0) {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"<nil>","");
        }
        else {
          DebugString_abi_cxx11_((string *)local_1b0,pPVar1);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 **)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter.cc"
               ,0x29a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Bad op in Prefilter::DebugString: ",0x22);
    std::ostream::operator<<(local_1b0 + 8,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prefilter::DebugString() const {
  switch (op_) {
    default:
      LOG(DFATAL) << "Bad op in Prefilter::DebugString: " << op_;
      return StringPrintf("op%d", op_);
    case NONE:
      return "*no-matches*";
    case ATOM:
      return atom_;
    case ALL:
      return "";
    case AND: {
      std::string s = "";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += " ";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      return s;
    }
    case OR: {
      std::string s = "(";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += "|";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      s += ")";
      return s;
    }
  }
}